

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_jp.c
# Opt level: O0

HPDF_STATUS MS_PGothic_Init(HPDF_FontDef fontdef)

{
  HPDF_Box HVar1;
  undefined8 local_30;
  undefined8 local_28;
  HPDF_STATUS ret;
  HPDF_FontDef fontdef_local;
  
  fontdef->ascent = 0x35b;
  fontdef->descent = -0x8c;
  fontdef->cap_height = 0x2a7;
  HVar1 = HPDF_ToBox(-0x79,-0x88,0x3e4,0x35b);
  local_30 = HVar1._0_8_;
  (fontdef->font_bbox).left = (HPDF_REAL)(undefined4)local_30;
  (fontdef->font_bbox).bottom = (HPDF_REAL)local_30._4_4_;
  local_28 = HVar1._8_8_;
  (fontdef->font_bbox).right = (HPDF_REAL)(undefined4)local_28;
  (fontdef->font_bbox).top = (HPDF_REAL)local_28._4_4_;
  fontdef->flags = 4;
  fontdef->italic_angle = 0;
  fontdef->stemv = 0x4e;
  fontdef_local = (HPDF_FontDef)HPDF_CIDFontDef_AddWidth(fontdef,MS_PGothic_W_ARRAY);
  if (fontdef_local == (HPDF_FontDef)0x0) {
    fontdef->type = HPDF_FONTDEF_TYPE_CID;
    fontdef->valid = 1;
    fontdef_local = (HPDF_FontDef)0x0;
  }
  return (HPDF_STATUS)fontdef_local;
}

Assistant:

static HPDF_STATUS
MS_PGothic_Init  (HPDF_FontDef   fontdef)
{
    HPDF_STATUS ret;

    HPDF_PTRACE ((" HPDF_FontDef_MS_PGothic_Init\n"));

    fontdef->ascent = 859;
    fontdef->descent = -140;
    fontdef->cap_height = 679;
    fontdef->font_bbox = HPDF_ToBox(-121, -136, 996, 859);
    fontdef->flags = HPDF_FONT_SYMBOLIC;
    fontdef->italic_angle = 0;
    fontdef->stemv = 78;
    if ((ret = HPDF_CIDFontDef_AddWidth (fontdef, MS_PGothic_W_ARRAY)) !=
                HPDF_OK) {
        return ret;
    }

    fontdef->type = HPDF_FONTDEF_TYPE_CID;
    fontdef->valid = HPDF_TRUE;

    return HPDF_OK;
}